

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_hash.c
# Opt level: O0

LY_ERR lyd_hash(lyd_node *node)

{
  char *pcVar1;
  uint32_t uVar2;
  size_t sVar3;
  bool bVar4;
  lyd_node_term *llist;
  lyd_node_term *key;
  lyd_node_inner *list;
  size_t key_len;
  char *pcStack_28;
  ly_bool dyn;
  void *hash_key;
  lyd_node *iter;
  lyd_node *node_local;
  
  if (node->schema != (lysc_node *)0x0) {
    pcVar1 = node->schema->module->name;
    iter = node;
    sVar3 = strlen(node->schema->module->name);
    uVar2 = lyht_hash_multi(0,pcVar1,sVar3);
    iter->hash = uVar2;
    uVar2 = iter->hash;
    pcVar1 = iter->schema->name;
    sVar3 = strlen(iter->schema->name);
    uVar2 = lyht_hash_multi(uVar2,pcVar1,sVar3);
    iter->hash = uVar2;
    if (iter->schema->nodetype == 0x10) {
      if ((iter->schema->flags & 0x200) == 0) {
        hash_key = *(void **)(iter + 1);
        while( true ) {
          bVar4 = false;
          if ((hash_key != (void *)0x0) && (bVar4 = false, *(long *)((long)hash_key + 8) != 0)) {
            bVar4 = (*(ushort *)(*(long *)((long)hash_key + 8) + 2) & 0x100) != 0;
          }
          if (!bVar4) break;
          pcStack_28 = (char *)(**(code **)(*(long *)(*(long *)((long)hash_key + 0x40) + 0x10) +
                                           0x28))(0,(long)hash_key + 0x38,5,0,(long)&key_len + 7,
                                                  &list);
          uVar2 = lyht_hash_multi(iter->hash,pcStack_28,(size_t)list);
          iter->hash = uVar2;
          if (key_len._7_1_ != '\0') {
            free(pcStack_28);
          }
          hash_key = *(void **)((long)hash_key + 0x18);
        }
      }
      else {
        uVar2 = lyht_hash_multi(iter->hash,(char *)0x0,0);
        iter->hash = uVar2;
      }
    }
    else if (iter->schema->nodetype == 8) {
      pcStack_28 = (char *)(*(code *)(iter[1].schema)->parent->name)
                                     (0,iter + 1,5,0,(long)&key_len + 7,&list);
      uVar2 = lyht_hash_multi(iter->hash,pcStack_28,(size_t)list);
      iter->hash = uVar2;
      if (key_len._7_1_ != '\0') {
        free(pcStack_28);
      }
    }
    uVar2 = lyht_hash_multi(iter->hash,(char *)0x0,0);
    iter->hash = uVar2;
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyd_hash(struct lyd_node *node)
{
    struct lyd_node *iter;
    const void *hash_key;
    ly_bool dyn;
    size_t key_len;

    if (!node->schema) {
        return LY_SUCCESS;
    }

    /* hash always starts with the module and schema name */
    node->hash = lyht_hash_multi(0, node->schema->module->name, strlen(node->schema->module->name));
    node->hash = lyht_hash_multi(node->hash, node->schema->name, strlen(node->schema->name));

    if (node->schema->nodetype == LYS_LIST) {
        if (node->schema->flags & LYS_KEYLESS) {
            /* key-less list simply calls hash function again with empty key,
             * just so that it differs from the first-instance hash
             */
            node->hash = lyht_hash_multi(node->hash, NULL, 0);
        } else {
            struct lyd_node_inner *list = (struct lyd_node_inner *)node;

            /* list hash is made up from its keys */
            for (iter = list->child; iter && iter->schema && (iter->schema->flags & LYS_KEY); iter = iter->next) {
                struct lyd_node_term *key = (struct lyd_node_term *)iter;

                hash_key = key->value.realtype->plugin->print(NULL, &key->value, LY_VALUE_LYB, NULL, &dyn, &key_len);
                node->hash = lyht_hash_multi(node->hash, hash_key, key_len);
                if (dyn) {
                    free((void *)hash_key);
                }
            }
        }
    } else if (node->schema->nodetype == LYS_LEAFLIST) {
        /* leaf-list adds its hash key */
        struct lyd_node_term *llist = (struct lyd_node_term *)node;

        hash_key = llist->value.realtype->plugin->print(NULL, &llist->value, LY_VALUE_LYB, NULL, &dyn, &key_len);
        node->hash = lyht_hash_multi(node->hash, hash_key, key_len);
        if (dyn) {
            free((void *)hash_key);
        }
    }

    /* finish the hash */
    node->hash = lyht_hash_multi(node->hash, NULL, 0);

    return LY_SUCCESS;
}